

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O0

int Lodtalk::IdentityDictionary::stAssociationAtOrNil(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Oop OVar2;
  IdentityDictionary *self;
  Oop key;
  Oop selfOop;
  InterpreterProxy *interpreter_local;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])();
    OVar2.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    OVar2.field_0.uintValue._4_4_ = extraout_var_01;
    OVar2 = getAssociationOrNil((IdentityDictionary *)CONCAT44(extraout_var_00,iVar1),OVar2);
    interpreter_local._4_4_ =
         (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar2.field_0);
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int IdentityDictionary::stAssociationAtOrNil(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    Oop selfOop = interpreter->getReceiver();
    Oop key = interpreter->getTemporary(0);
    auto self = reinterpret_cast<IdentityDictionary*> (selfOop.pointer);
    return interpreter->returnOop(self->getAssociationOrNil(key));
}